

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBasisToolsBspline.h
# Opt level: O1

void chrono::geometry::ChBasisToolsBspline::BasisEvaluate
               (int p,int i,double u,ChVectorDynamic<> *knotU,ChVectorDynamic<> *N)

{
  double dVar1;
  ulong uVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  double *pdVar6;
  void *pvVar7;
  double *pdVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  uVar2 = (N->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (0 < (long)uVar2) {
    pdVar3 = (N->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    *pdVar3 = 1.0;
    uVar9 = 0xffffffffffffffff;
    if (-2 < p) {
      uVar9 = (long)p * 8 + 8;
    }
    pdVar6 = (double *)operator_new__(uVar9);
    pvVar7 = operator_new__(uVar9);
    if (0 < p) {
      pdVar4 = (knotU->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      lVar5 = (knotU->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows;
      uVar9 = 1;
      pdVar8 = pdVar6;
      do {
        pdVar8 = pdVar8 + 1;
        iVar10 = (i + 1) - (int)uVar9;
        if ((iVar10 < 0) || (lVar5 <= iVar10)) {
LAB_00637064:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                       );
        }
        pdVar6[uVar9] = u - pdVar4[iVar10];
        lVar11 = uVar9 + (long)i;
        if ((lVar11 < 0) || (lVar5 <= lVar11)) goto LAB_00637064;
        *(double *)((long)pvVar7 + uVar9 * 8) = pdVar4[lVar11] - u;
        auVar14 = ZEXT1664(ZEXT816(0));
        uVar13 = 0;
        pdVar12 = pdVar8;
        do {
          if (uVar2 == uVar13) goto LAB_00637045;
          dVar1 = *(double *)((long)pvVar7 + uVar13 * 8 + 8);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = dVar1;
          auVar15._0_8_ = pdVar3[uVar13] / (dVar1 + *pdVar12);
          auVar15._8_8_ = 0;
          auVar16 = vfmadd231sd_fma(auVar14._0_16_,auVar15,auVar16);
          pdVar3[uVar13] = auVar16._0_8_;
          uVar13 = uVar13 + 1;
          dVar1 = *pdVar12;
          auVar14 = ZEXT864((ulong)(auVar15._0_8_ * dVar1));
          pdVar12 = pdVar12 + -1;
        } while (uVar9 != uVar13);
        if (uVar9 == uVar2) goto LAB_00637045;
        pdVar3[uVar9] = auVar15._0_8_ * dVar1;
        uVar9 = uVar9 + 1;
      } while (uVar9 != p + 1);
    }
    operator_delete__(pdVar6);
    operator_delete__(pvVar7);
    return;
  }
LAB_00637045:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

static void BasisEvaluate(const int p,                     ///< order
                              const int i,                     ///< knot span, assume aready computed via FindSpan()
                              const double u,                  ///< parameter
                              const ChVectorDynamic<>& knotU,  ///< knot vector
                              ChVectorDynamic<>& N  ///< here return basis functions N evaluated at u, that is: N(u)
    ) {
        N(0) = 1.0;

        int j, r;
        double* left = new double[p + 1];
        double* right = new double[p + 1];
        double saved, temp;

        for (j = 1; j <= p; ++j) {
            left[j] = u - knotU(i + 1 - j);
            right[j] = knotU(i + j) - u;
            saved = 0.0;
            for (r = 0; r < j; ++r) {
                temp = N(r) / (right[r + 1] + left[j - r]);
                N(r) = saved + right[r + 1] * temp;
                saved = left[j - r] * temp;
            }
            N(j) = saved;
        }

        delete[] left;
        delete[] right;
    }